

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O1

void __thiscall wasm::MemoryCopy::finalize(MemoryCopy *this)

{
  Expression *pEVar1;
  Expression *pEVar2;
  Expression *pEVar3;
  
  pEVar1 = this->dest;
  if (((pEVar1 != (Expression *)0x0) && (pEVar2 = this->source, pEVar2 != (Expression *)0x0)) &&
     (pEVar3 = this->size, pEVar3 != (Expression *)0x0)) {
    (this->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id = 0;
    if ((((pEVar1->type).id == 1) || ((pEVar2->type).id == 1)) || ((pEVar3->type).id == 1)) {
      (this->super_SpecificExpression<(wasm::Expression::Id)38>).super_Expression.type.id = 1;
    }
    return;
  }
  __assert_fail("dest && source && size",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm.cpp"
                ,0x1b6,"void wasm::MemoryCopy::finalize()");
}

Assistant:

void MemoryCopy::finalize() {
  assert(dest && source && size);
  type = Type::none;
  if (dest->type == Type::unreachable || source->type == Type::unreachable ||
      size->type == Type::unreachable) {
    type = Type::unreachable;
  }
}